

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * pfederc::logCreateErrorMessage
                   (string *__return_storage_ptr__,Lexer *lexer,Position *pos,string *msg)

{
  ulong uVar1;
  string *psVar2;
  byte bVar3;
  size_t sVar4;
  size_t i_2;
  size_t i;
  ulong uVar5;
  size_t i_1;
  unsigned_long uVar6;
  string sStack_128;
  string *local_108;
  ulong local_100;
  ulong local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::operator+(&local_f0,&lexer->filePath,":");
  std::__cxx11::to_string(&sStack_128,pos->line + 1);
  std::operator+(&local_d0,&local_f0,&sStack_128);
  std::operator+(&local_90,&local_d0,":");
  std::__cxx11::to_string
            (&local_50,
             (pos->startIndex -
             (lexer->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[pos->line]) + 1);
  std::operator+(&local_b0,&local_90,&local_50);
  std::operator+(&local_70,&local_b0,": error: ");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&sStack_128);
  std::__cxx11::string::~string((string *)&local_f0);
  std::operator+(&local_f0,&local_70,msg);
  std::operator+(&local_d0,&local_f0,"\n");
  local_108 = __return_storage_ptr__;
  Lexer::getLineAt_abi_cxx11_(&local_b0,lexer,pos->line);
  std::operator+(&sStack_128,&local_b0,'\n');
  std::__cxx11::string::~string((string *)&local_b0);
  sVar4 = Lexer::getLineNumber(lexer,pos->startIndex);
  uVar6 = (lexer->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar4];
  Lexer::getLineNumber(lexer,pos->endIndex);
  sVar4 = pos->endIndex;
  local_f8 = pos->startIndex;
  if (pos->startIndex <= sVar4) {
    local_f8 = sVar4;
  }
  local_100 = Lexer::getLineNumber(lexer,sVar4);
  uVar5 = pos->line;
  if (uVar5 < local_100) {
    for (; uVar5 <= local_100; uVar5 = uVar5 + 1) {
      Lexer::getLineAt_abi_cxx11_(&local_90,lexer,uVar5);
      std::operator+(&local_b0,&local_90,'\n');
      std::__cxx11::string::append((string *)&sStack_128);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  while( true ) {
    uVar5 = pos->startIndex;
    if ((uVar5 <= uVar6) || ((lexer->fileContent)._M_string_length <= uVar6)) break;
    bVar3 = (lexer->fileContent)._M_dataplus._M_p[uVar6];
    if (bVar3 == 9) {
      std::__cxx11::string::append((char *)&sStack_128);
    }
    else if (-0x11 < (char)bVar3 || (bVar3 & 0xd0) == 0xc0) {
      std::__cxx11::string::push_back((char)&sStack_128);
    }
    uVar6 = uVar6 + 1;
  }
  for (; (psVar2 = local_108, uVar5 <= local_f8 &&
         (uVar1 = (lexer->fileContent)._M_string_length, uVar5 <= uVar1)); uVar5 = uVar5 + 1) {
    bVar3 = 0x20;
    if ((uVar5 == uVar1) || (bVar3 = (lexer->fileContent)._M_dataplus._M_p[uVar5], bVar3 != 9)) {
      if (-0x11 < (char)bVar3 || (bVar3 & 0xd0) == 0xc0) {
        std::__cxx11::string::push_back((char)&sStack_128);
      }
    }
    else {
      std::__cxx11::string::append((char *)&sStack_128);
    }
  }
  std::operator+(local_108,&local_d0,&sStack_128);
  std::__cxx11::string::~string((string *)&sStack_128);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  return psVar2;
}

Assistant:

std::string pfederc::logCreateErrorMessage(const Lexer &lexer, const Position &pos, const std::string &msg) noexcept {
  return _logLexerErrorBase(lexer, pos) + msg + "\n" + _logLexerErrorMark(lexer, pos);
}